

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdf.cpp
# Opt level: O0

void sdf_tools::exportSdf(module *m)

{
  char (*extra_1) [38];
  class_<sdf_tools::sdf::SdfSmoothUnion,_std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>_> *this;
  void *pvVar1;
  sdf_tools *this_00;
  char *pcVar2;
  int iVar3;
  longdouble lVar4;
  arg aVar5;
  arg aVar6;
  arg aVar7;
  shared_class<Sdf> pysdf;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 uVar8;
  int iVar9;
  undefined4 in_stack_fffffffffffff7fc;
  undefined4 uVar10;
  undefined2 in_stack_fffffffffffff800;
  undefined2 uVar11;
  undefined6 in_stack_fffffffffffff802;
  constructor<std::shared_ptr<sdf_tools::sdf::Sdf>_> *in_stack_fffffffffffff808;
  arg *in_stack_fffffffffffff810;
  constructor<std::shared_ptr<sdf_tools::sdf::Sdf>,_std::shared_ptr<sdf_tools::sdf::Sdf>,_float>
  *in_stack_fffffffffffff818;
  class_<sdf_tools::sdf::SdfDifference,_std::shared_ptr<sdf_tools::sdf::SdfDifference>_>
  *in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff830;
  undefined4 in_stack_fffffffffffff834;
  char (*in_stack_fffffffffffff870) [109];
  class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_> *in_stack_fffffffffffff878;
  char *in_stack_fffffffffffff880;
  class_<sdf_tools::sdf::SdfIntersection,_std::shared_ptr<sdf_tools::sdf::SdfIntersection>_>
  *in_stack_fffffffffffff888;
  handle in_stack_fffffffffffff890;
  arg *in_stack_fffffffffffff898;
  offset_in_Grid_to_subr *in_stack_fffffffffffff8a0;
  char *in_stack_fffffffffffff8a8;
  class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_> *in_stack_fffffffffffff8b0;
  
  pybind11::class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_>::class_<char[30]>
            ((class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_> *)
             in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             (char (*) [30])in_stack_fffffffffffff878);
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>::
  def<float(sdf_tools::sdf::Sdf::*)(sdf_tools::real3)const,pybind11::arg,char[130]>
            (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
             in_stack_fffffffffffff898,(char (*) [130])in_stack_fffffffffffff890.m_ptr);
  pybind11::class_<sdf_tools::sdf::SdfBox,std::shared_ptr<sdf_tools::sdf::SdfBox>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            ((class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_> *)
             in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,(char (*) [36])in_stack_fffffffffffff870);
  pybind11::init<sdf_tools::real3,sdf_tools::real3,bool>();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  pybind11::class_<sdf_tools::sdf::SdfBox,std::shared_ptr<sdf_tools::sdf::SdfBox>>::
  def<sdf_tools::real3,sdf_tools::real3,bool,pybind11::arg,pybind11::arg,pybind11::arg,char[198]>
            ((class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_> *)
             in_stack_fffffffffffff820,
             (constructor<sdf_tools::real3,_sdf_tools::real3,_bool> *)in_stack_fffffffffffff818,
             in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808,
             (arg *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             (char (*) [198])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  pybind11::class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_>::~class_
            ((class_<sdf_tools::sdf::SdfBox,_std::shared_ptr<sdf_tools::sdf::SdfBox>_> *)0x171cc8);
  pybind11::class_<sdf_tools::sdf::SdfCapsule,std::shared_ptr<sdf_tools::sdf::SdfCapsule>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[58]>
            ((class_<sdf_tools::sdf::SdfCapsule,_std::shared_ptr<sdf_tools::sdf::SdfCapsule>_> *)
             in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,(char (*) [58])in_stack_fffffffffffff870);
  pybind11::init<sdf_tools::real3,sdf_tools::real3,float,bool>();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  uVar8 = 0x1b0c59;
  uVar10 = 0;
  pybind11::class_<sdf_tools::sdf::SdfCapsule,std::shared_ptr<sdf_tools::sdf::SdfCapsule>>::
  def<sdf_tools::real3,sdf_tools::real3,float,bool,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,char[257]>
            ((class_<sdf_tools::sdf::SdfCapsule,_std::shared_ptr<sdf_tools::sdf::SdfCapsule>_> *)
             in_stack_fffffffffffff820,
             (constructor<sdf_tools::real3,_sdf_tools::real3,_float,_bool> *)
             in_stack_fffffffffffff818,in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808,
             (arg *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             (arg *)
             "\n\n            Args:\n                start: First end of the segment.\n                end:  Second end of the segment.\n                radius: Radius of the capsule.\n                inside: Whether the domain is inside the capsule or outside of it.\n        "
             ,(char (*) [257])CONCAT44(in_stack_fffffffffffff834,in_stack_fffffffffffff830));
  pybind11::class_<sdf_tools::sdf::SdfCapsule,_std::shared_ptr<sdf_tools::sdf::SdfCapsule>_>::
  ~class_((class_<sdf_tools::sdf::SdfCapsule,_std::shared_ptr<sdf_tools::sdf::SdfCapsule>_> *)
          0x171ee4);
  pybind11::class_<sdf_tools::sdf::SdfEdges,std::shared_ptr<sdf_tools::sdf::SdfEdges>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[65]>
            ((class_<sdf_tools::sdf::SdfEdges,_std::shared_ptr<sdf_tools::sdf::SdfEdges>_> *)
             in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,(char (*) [65])in_stack_fffffffffffff870);
  pybind11::init<std::vector<sdf_tools::real2,std::allocator<sdf_tools::real2>>&,bool,int>();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::arg::operator=
            ((arg *)in_stack_fffffffffffff808,
             (int *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800));
  pybind11::class_<sdf_tools::sdf::SdfEdges,std::shared_ptr<sdf_tools::sdf::SdfEdges>>::
  def<std::vector<sdf_tools::real2,std::allocator<sdf_tools::real2>>&,bool,int,pybind11::arg,pybind11::arg,pybind11::arg_v,char[258]>
            ((class_<sdf_tools::sdf::SdfEdges,_std::shared_ptr<sdf_tools::sdf::SdfEdges>_> *)
             in_stack_fffffffffffff820,
             (constructor<std::vector<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>_&,_bool,_int>
              *)in_stack_fffffffffffff818,in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808
             ,(arg_v *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             (char (*) [258])CONCAT44(uVar10,uVar8));
  pybind11::arg_v::~arg_v((arg_v *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800));
  pybind11::class_<sdf_tools::sdf::SdfEdges,_std::shared_ptr<sdf_tools::sdf::SdfEdges>_>::~class_
            ((class_<sdf_tools::sdf::SdfEdges,_std::shared_ptr<sdf_tools::sdf::SdfEdges>_> *)
             0x1720c8);
  pybind11::class_<sdf_tools::sdf::SdfFromMesh,std::shared_ptr<sdf_tools::sdf::SdfFromMesh>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            ((class_<sdf_tools::sdf::SdfFromMesh,_std::shared_ptr<sdf_tools::sdf::SdfFromMesh>_> *)
             in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,(char (*) [36])in_stack_fffffffffffff870);
  pybind11::
  init<std::vector<sdf_tools::int3,std::allocator<sdf_tools::int3>>,std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,bool>
            ();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::class_<sdf_tools::sdf::SdfFromMesh,std::shared_ptr<sdf_tools::sdf::SdfFromMesh>>::
  def<std::vector<sdf_tools::int3,std::allocator<sdf_tools::int3>>,std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,bool,pybind11::arg,pybind11::arg,pybind11::arg,char[229]>
            ((class_<sdf_tools::sdf::SdfFromMesh,_std::shared_ptr<sdf_tools::sdf::SdfFromMesh>_> *)
             in_stack_fffffffffffff820,
             (constructor<std::vector<sdf_tools::int3,_std::allocator<sdf_tools::int3>_>,_std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_bool>
              *)in_stack_fffffffffffff818,in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808
             ,(arg *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             (char (*) [229])CONCAT44(uVar10,uVar8));
  pybind11::class_<sdf_tools::sdf::SdfFromMesh,_std::shared_ptr<sdf_tools::sdf::SdfFromMesh>_>::
  ~class_((class_<sdf_tools::sdf::SdfFromMesh,_std::shared_ptr<sdf_tools::sdf::SdfFromMesh>_> *)
          0x172275);
  pybind11::
  class_<sdf_tools::sdf::SdfPiecewisePipe,std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[109]>
            ((class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>
              *)in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  pybind11::init<std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,float,bool>();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::
  class_<sdf_tools::sdf::SdfPiecewisePipe,std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>>::
  def<std::vector<sdf_tools::real3,std::allocator<sdf_tools::real3>>,float,bool,pybind11::arg,pybind11::arg,pybind11::arg,char[236]>
            ((class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>
              *)in_stack_fffffffffffff820,
             (constructor<std::vector<sdf_tools::real3,_std::allocator<sdf_tools::real3>_>,_float,_bool>
              *)in_stack_fffffffffffff818,in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808
             ,(arg *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             (char (*) [236])CONCAT44(uVar10,uVar8));
  pybind11::
  class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>::
  ~class_((class_<sdf_tools::sdf::SdfPiecewisePipe,_std::shared_ptr<sdf_tools::sdf::SdfPiecewisePipe>_>
           *)0x172422);
  pybind11::class_<sdf_tools::sdf::SdfPlate,std::shared_ptr<sdf_tools::sdf::SdfPlate>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[97]>
            ((class_<sdf_tools::sdf::SdfPlate,_std::shared_ptr<sdf_tools::sdf::SdfPlate>_> *)
             in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,(char (*) [97])in_stack_fffffffffffff870);
  pybind11::init<sdf_tools::real3,sdf_tools::real3>();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::class_<sdf_tools::sdf::SdfPlate,std::shared_ptr<sdf_tools::sdf::SdfPlate>>::
  def<sdf_tools::real3,sdf_tools::real3,pybind11::arg,pybind11::arg,char[209]>
            ((class_<sdf_tools::sdf::SdfPlate,_std::shared_ptr<sdf_tools::sdf::SdfPlate>_> *)
             in_stack_fffffffffffff820,
             (constructor<sdf_tools::real3,_sdf_tools::real3> *)in_stack_fffffffffffff818,
             in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808,
             (char (*) [209])CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800));
  pybind11::class_<sdf_tools::sdf::SdfPlate,_std::shared_ptr<sdf_tools::sdf::SdfPlate>_>::~class_
            ((class_<sdf_tools::sdf::SdfPlate,_std::shared_ptr<sdf_tools::sdf::SdfPlate>_> *)
             0x172566);
  pybind11::class_<sdf_tools::sdf::SdfSphere,std::shared_ptr<sdf_tools::sdf::SdfSphere>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[56]>
            ((class_<sdf_tools::sdf::SdfSphere,_std::shared_ptr<sdf_tools::sdf::SdfSphere>_> *)
             in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,(char (*) [56])in_stack_fffffffffffff870);
  pybind11::init<sdf_tools::real3,float,bool>();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  iVar3 = 0x1b12c5;
  pybind11::class_<sdf_tools::sdf::SdfSphere,std::shared_ptr<sdf_tools::sdf::SdfSphere>>::
  def<sdf_tools::real3,float,bool,pybind11::arg,pybind11::arg,pybind11::arg,char[203]>
            ((class_<sdf_tools::sdf::SdfSphere,_std::shared_ptr<sdf_tools::sdf::SdfSphere>_> *)
             in_stack_fffffffffffff820,
             (constructor<sdf_tools::real3,_float,_bool> *)in_stack_fffffffffffff818,
             in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808,
             (arg *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             (char (*) [203])CONCAT44(uVar10,uVar8));
  pybind11::class_<sdf_tools::sdf::SdfSphere,_std::shared_ptr<sdf_tools::sdf::SdfSphere>_>::~class_
            ((class_<sdf_tools::sdf::SdfSphere,_std::shared_ptr<sdf_tools::sdf::SdfSphere>_> *)
             0x172713);
  pybind11::class_<sdf_tools::sdf::SdfUnion,std::shared_ptr<sdf_tools::sdf::SdfUnion>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[31]>
            ((class_<sdf_tools::sdf::SdfUnion,_std::shared_ptr<sdf_tools::sdf::SdfUnion>_> *)
             in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,(char (*) [31])in_stack_fffffffffffff870);
  pybind11::init<std::shared_ptr<sdf_tools::sdf::Sdf>,std::shared_ptr<sdf_tools::sdf::Sdf>>();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::class_<sdf_tools::sdf::SdfUnion,std::shared_ptr<sdf_tools::sdf::SdfUnion>>::
  def<std::shared_ptr<sdf_tools::sdf::Sdf>,std::shared_ptr<sdf_tools::sdf::Sdf>,pybind11::arg,pybind11::arg,char[87]>
            ((class_<sdf_tools::sdf::SdfUnion,_std::shared_ptr<sdf_tools::sdf::SdfUnion>_> *)
             in_stack_fffffffffffff820,
             (constructor<std::shared_ptr<sdf_tools::sdf::Sdf>,_std::shared_ptr<sdf_tools::sdf::Sdf>_>
              *)in_stack_fffffffffffff818,in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808
             ,(char (*) [87])CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800));
  pybind11::class_<sdf_tools::sdf::SdfUnion,_std::shared_ptr<sdf_tools::sdf::SdfUnion>_>::~class_
            ((class_<sdf_tools::sdf::SdfUnion,_std::shared_ptr<sdf_tools::sdf::SdfUnion>_> *)
             0x172857);
  pybind11::class_<sdf_tools::sdf::SdfIntersection,std::shared_ptr<sdf_tools::sdf::SdfIntersection>>
  ::class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[38]>
            (in_stack_fffffffffffff888,in_stack_fffffffffffff890,in_stack_fffffffffffff880,
             in_stack_fffffffffffff878,(char (*) [38])in_stack_fffffffffffff870);
  pybind11::init<std::shared_ptr<sdf_tools::sdf::Sdf>,std::shared_ptr<sdf_tools::sdf::Sdf>>();
  aVar5 = pybind11::literals::operator____a
                    ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
                     CONCAT44(uVar10,uVar8));
  aVar6 = pybind11::literals::operator____a
                    ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
                     CONCAT44(uVar10,uVar8));
  pybind11::class_<sdf_tools::sdf::SdfIntersection,std::shared_ptr<sdf_tools::sdf::SdfIntersection>>
  ::
  def<std::shared_ptr<sdf_tools::sdf::Sdf>,std::shared_ptr<sdf_tools::sdf::Sdf>,pybind11::arg,pybind11::arg,char[87]>
            ((class_<sdf_tools::sdf::SdfIntersection,_std::shared_ptr<sdf_tools::sdf::SdfIntersection>_>
              *)in_stack_fffffffffffff820,
             (constructor<std::shared_ptr<sdf_tools::sdf::Sdf>,_std::shared_ptr<sdf_tools::sdf::Sdf>_>
              *)in_stack_fffffffffffff818,in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808
             ,(char (*) [87])CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800));
  pybind11::
  class_<sdf_tools::sdf::SdfIntersection,_std::shared_ptr<sdf_tools::sdf::SdfIntersection>_>::
  ~class_((class_<sdf_tools::sdf::SdfIntersection,_std::shared_ptr<sdf_tools::sdf::SdfIntersection>_>
           *)0x17299b);
  pybind11::class_<sdf_tools::sdf::SdfDifference,std::shared_ptr<sdf_tools::sdf::SdfDifference>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[36]>
            (aVar5._8_8_,(PyObject *)aVar5.name,aVar6.name,aVar6._8_8_,
             (char (*) [36])in_stack_fffffffffffff870);
  pybind11::init<std::shared_ptr<sdf_tools::sdf::Sdf>,std::shared_ptr<sdf_tools::sdf::Sdf>>();
  aVar7 = pybind11::literals::operator____a
                    ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
                     CONCAT44(uVar10,uVar8));
  extra_1 = (char (*) [38])aVar7.name;
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  pybind11::class_<sdf_tools::sdf::SdfDifference,std::shared_ptr<sdf_tools::sdf::SdfDifference>>::
  def<std::shared_ptr<sdf_tools::sdf::Sdf>,std::shared_ptr<sdf_tools::sdf::Sdf>,pybind11::arg,pybind11::arg,char[138]>
            (in_stack_fffffffffffff820,
             (constructor<std::shared_ptr<sdf_tools::sdf::Sdf>,_std::shared_ptr<sdf_tools::sdf::Sdf>_>
              *)in_stack_fffffffffffff818,in_stack_fffffffffffff810,(arg *)in_stack_fffffffffffff808
             ,(char (*) [138])CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800));
  pybind11::class_<sdf_tools::sdf::SdfDifference,_std::shared_ptr<sdf_tools::sdf::SdfDifference>_>::
  ~class_((class_<sdf_tools::sdf::SdfDifference,_std::shared_ptr<sdf_tools::sdf::SdfDifference>_> *)
          0x172ac7);
  pcVar2 = "Smooth Union between two SDF objects.";
  pybind11::class_<sdf_tools::sdf::SdfSmoothUnion,std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[38]>
            (aVar5._8_8_,(PyObject *)aVar5.name,aVar6.name,aVar6._8_8_,extra_1);
  pybind11::init<std::shared_ptr<sdf_tools::sdf::Sdf>,std::shared_ptr<sdf_tools::sdf::Sdf>,float>();
  pybind11::literals::operator____a
            ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
             CONCAT44(uVar10,uVar8));
  this_00 = (sdf_tools *)0x1ae29d;
  pvVar1 = (void *)0x1;
  aVar7 = pybind11::literals::operator____a
                    ((char *)CONCAT62(in_stack_fffffffffffff802,in_stack_fffffffffffff800),
                     CONCAT44(uVar10,uVar8));
  lVar4 = (longdouble)32.0;
  iVar9 = SUB104(lVar4,0);
  uVar8 = (undefined4)((unkuint10)lVar4 >> 0x20);
  uVar11 = (undefined2)((unkuint10)lVar4 >> 0x40);
  operator____r(this_00,pvVar1,aVar7._8_8_,(int)aVar7.name,pcVar2,iVar3,iVar9);
  aVar7 = pybind11::literals::operator____a
                    ((char *)CONCAT62(in_stack_fffffffffffff802,uVar11),CONCAT44(uVar8,iVar9));
  this = aVar7._8_8_;
  pybind11::arg::operator=
            ((arg *)in_stack_fffffffffffff808,(float *)CONCAT62(in_stack_fffffffffffff802,uVar11));
  pybind11::class_<sdf_tools::sdf::SdfSmoothUnion,std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>>::
  def<std::shared_ptr<sdf_tools::sdf::Sdf>,std::shared_ptr<sdf_tools::sdf::Sdf>,float,pybind11::arg,pybind11::arg,pybind11::arg_v,char[144]>
            (this,in_stack_fffffffffffff818,in_stack_fffffffffffff810,
             (arg *)in_stack_fffffffffffff808,(arg_v *)CONCAT62(in_stack_fffffffffffff802,uVar11),
             (char (*) [144])CONCAT44(uVar8,iVar9));
  pybind11::arg_v::~arg_v((arg_v *)CONCAT62(in_stack_fffffffffffff802,uVar11));
  pybind11::class_<sdf_tools::sdf::SdfSmoothUnion,_std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>_>
  ::~class_((class_<sdf_tools::sdf::SdfSmoothUnion,_std::shared_ptr<sdf_tools::sdf::SdfSmoothUnion>_>
             *)0x172ca3);
  pybind11::class_<sdf_tools::sdf::SdfComplement,std::shared_ptr<sdf_tools::sdf::SdfComplement>>::
  class_<pybind11::class_<sdf_tools::sdf::Sdf,std::shared_ptr<sdf_tools::sdf::Sdf>>,char[31]>
            (aVar5._8_8_,(PyObject *)aVar5.name,aVar6.name,aVar6._8_8_,(char (*) [31])extra_1);
  pybind11::init<std::shared_ptr<sdf_tools::sdf::Sdf>>();
  aVar5 = pybind11::literals::operator____a
                    ((char *)CONCAT62(in_stack_fffffffffffff802,uVar11),CONCAT44(uVar8,iVar9));
  pybind11::class_<sdf_tools::sdf::SdfComplement,std::shared_ptr<sdf_tools::sdf::SdfComplement>>::
  def<std::shared_ptr<sdf_tools::sdf::Sdf>,pybind11::arg,char[61]>
            (aVar5._8_8_,in_stack_fffffffffffff808,(arg *)CONCAT62(in_stack_fffffffffffff802,uVar11)
             ,(char (*) [61])CONCAT44(uVar8,iVar9));
  pybind11::class_<sdf_tools::sdf::SdfComplement,_std::shared_ptr<sdf_tools::sdf::SdfComplement>_>::
  ~class_((class_<sdf_tools::sdf::SdfComplement,_std::shared_ptr<sdf_tools::sdf::SdfComplement>_> *)
          0x172d72);
  pybind11::class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_>::~class_
            ((class_<sdf_tools::sdf::Sdf,_std::shared_ptr<sdf_tools::sdf::Sdf>_> *)0x172d7f);
  return;
}

Assistant:

void exportSdf(py::module& m)
{
    py::shared_class<Sdf> pysdf(m, "Sdf", R"(
        Base sdf class.
    )");

    pysdf.def("at", &Sdf::at,
              "r"_a, R"(
        Evaluate the SDF field at the given position.

        Args:
            r: The position where to evaluate the SDF.
    )");

    py::shared_class<SdfBox> (m, "Box", pysdf, R"(
        Box aligned with axes
    )")
        .def(py::init <real3, real3, bool> (),
             "low"_a, "high"_a, "inside"_a, R"(

            Args:
                low: Lower corner of the box.
                high: Upper corner of the box.
                inside: ``True`` if the interior is inside the given shape.
        )");

    py::shared_class<SdfCapsule> (m, "Capsule", pysdf, R"(
        Capsule defined by a segment and a radius.

    )")
        .def(py::init <real3, real3, real, bool> (),
             "start"_a, "end"_a, "radius"_a, "inside"_a, R"(

            Args:
                start: First end of the segment.
                end:  Second end of the segment.
                radius: Radius of the capsule.
                inside: Whether the domain is inside the capsule or outside of it.
        )");

    py::shared_class<SdfEdges> (m, "Edges", pysdf, R"(
        Closed polygon defined from edges in the xy plane.
    )")
        .def(py::init <std::vector<real2>&, bool, int> (),
             "edges"_a, "inside"_a, "nsamples"_a = 20, R"(

            Args:
                edges: List of vertices positions (2D).
                inside: ``True`` if the interior is inside the given shape.
                nsamples: Number of samples to find the sign of the SDF (more is more accurate).
        )");

    py::shared_class<SdfFromMesh> (m, "FromMesh", pysdf, R"(
        Closed triangle mesh.
    )")
        .def(py::init <std::vector<int3>, std::vector<real3>, bool> (),
             "faces"_a, "vertices"_a, "inside"_a, R"(

            Args:
                faces: List of vertex indices forming each face.
                vertices: List of vertices positions (3D).
                inside: ``True`` if the interior is inside the given shape.
        )");

    py::shared_class<SdfPiecewisePipe> (m, "PiecewisePipe", pysdf, R"(
        The union of many connected capsules, forming a piecewise linear pipe with a constant radius.

    )")
        .def(py::init <std::vector<real3>, real, bool> (),
             "vertices"_a, "radius"_a, "inside"_a, R"(

            Args:
                vertices: Coordinates of the points forming the center line.
                radius: Radius of the capsule.
                inside: Whether the domain is inside the capsule or outside of it.
        )");

    py::shared_class<SdfPlate> (m, "Plate", pysdf, R"(
        Plate defined by one point on the surface and the normal vector, pointing inside.

    )")
        .def(py::init <real3, real3> (),
             "point"_a, "normal"_a, R"(
            Args:
                point: One point on the plane.
                normal: The normal vector (not necessarily normalized, but must be non-zero)
                        pointing inside.
        )");

    py::shared_class<SdfSphere> (m, "Sphere", pysdf, R"(
        Sphere defined by its center and radius.

    )")
        .def(py::init <real3, real, bool> (),
             "center"_a, "radius"_a, "inside"_a, R"(

            Args:
                center: Center of the sphere.
                radius: Radius of the sphere.
                inside: Whether the domain is inside the sphere or outside of it.
        )");


    py::shared_class<SdfUnion> (m, "Union", pysdf, "Union between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
             "a"_a, "b"_a, R"(

        Args:
            a: The first sdf.
            b: The second sdf.

        )");

    py::shared_class<SdfIntersection> (m, "Intersection", pysdf, "Intersection between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
            "a"_a, "b"_a, R"(

        Args:
            a: The first sdf.
            b: The second sdf.

        )");

    py::shared_class<SdfDifference> (m, "Difference", pysdf, "Difference between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>>(),
            "a"_a, "b"_a, R"(

        Args:
            a: The original sdf.
            b: The sdf of the object that should be removed from the original.

        )");

    py::shared_class<SdfSmoothUnion> (m, "SmoothUnion", pysdf, "Smooth Union between two SDF objects.")
        .def(py::init<std::shared_ptr<Sdf>, std::shared_ptr<Sdf>, real>(),
             "a"_a, "b"_a, "k"_a=32.0_r, R"(

        Args:
            a: The first sdf.
            b: The second sdf.
            k: The smoothing parameter. Must be positive.
        )");

    py::shared_class<SdfComplement> (m, "Complement", pysdf, "Reverse interior and exterior.")
        .def(py::init<std::shared_ptr<Sdf>>(),
            "sdf"_a, R"(

        Args:
            sdf: The original sdf.

        )");

}